

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmTruth.c
# Opt level: O2

int Mpm_CutComputeTruth(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                       Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  word t;
  uint uVar1;
  uint uVar2;
  int Var;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  word *pwVar6;
  char *__function;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  Vec_Mem_t *p_00;
  char *__assertion;
  uint uVar11;
  int v;
  uint uVar12;
  Mpm_Cut_t *pMVar13;
  int Supp;
  ulong uVar14;
  bool bVar15;
  ulong local_68;
  Mpm_Cut_t *local_60;
  word t1;
  word t0;
  word local_48;
  word tC;
  word *local_38;
  
  iVar3 = p->nLutSize;
  local_60 = pCut;
  pwVar5 = Mpm_CutTruth(p,*(uint *)&pCut0->field_0x4 >> 1 & 0xffffff);
  pwVar6 = Mpm_CutTruth(p,*(uint *)&pCut1->field_0x4 >> 1 & 0xffffff);
  pMVar13 = local_60;
  if (iVar3 < 7) {
    t0 = -(ulong)((*(uint *)&pCut0->field_0x4 >> 0x19 & 1 ^ fCompl0) !=
                 (*(uint *)&pCut0->field_0x4 & 1)) ^ *pwVar5;
    t1 = -(ulong)((*(uint *)&pCut1->field_0x4 >> 0x19 & 1 ^ fCompl1) !=
                 (*(uint *)&pCut1->field_0x4 & 1)) ^ *pwVar6;
    tC = 0;
    Mpm_TruthStretch(&t0,local_60,pCut0,p->nLutSize);
    Mpm_TruthStretch(&t1,pMVar13,pCut1,p->nLutSize);
    if (pCutC != (Mpm_Cut_t *)0x0) {
      pwVar5 = Mpm_CutTruth(p,*(uint *)&pCutC->field_0x4 >> 1 & 0xffffff);
      tC = -(ulong)((*(uint *)&pCutC->field_0x4 >> 0x19 & 1 ^ fComplC) !=
                   (*(uint *)&pCutC->field_0x4 & 1)) ^ *pwVar5;
      Mpm_TruthStretch(&tC,pMVar13,pCutC,p->nLutSize);
    }
    if (6 < p->nLutSize) {
      __assert_fail("p->nLutSize <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                    ,0xa1,
                    "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    if (Type == 3) {
      local_68 = (t1 ^ t0) & tC ^ t0;
    }
    else if (Type == 2) {
      local_68 = t1 ^ t0;
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0xa8,
                      "int Mpm_CutComputeTruth6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      local_68 = t1 & t0;
    }
    bVar15 = (local_68 & 1) != 0;
    if (bVar15) {
      local_68 = ~local_68;
    }
    iVar3 = Vec_MemHashInsert(p->vTtMem,&local_68);
    uVar4 = Abc_Var2Lit(iVar3,(uint)bVar15);
    *(uint *)&pMVar13->field_0x4 = *(uint *)&pMVar13->field_0x4 & 0xfe000000 | uVar4 & 0x1ffffff;
    if (p->pPars->fCutMin == 0) {
      return 1;
    }
    pwVar5 = Mpm_CutTruth(p,uVar4 >> 1 & 0xffffff);
    t = *pwVar5;
    local_48 = t;
    if (0x37ffffff < *(uint *)&pMVar13->field_0x4) {
      __assert_fail("nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x436,"int Abc_Tt6SupportAndSize(word, int, int *)");
    }
    uVar12 = *(uint *)&pMVar13->field_0x4 >> 0x1b;
    uVar4 = 0;
    uVar10 = 0;
    uVar11 = 0;
    for (uVar9 = 0; pMVar13 = local_60, uVar12 != uVar9; uVar9 = uVar9 + 1) {
      iVar3 = Abc_Tt6HasVar(t,uVar9);
      uVar7 = 1 << ((byte)uVar9 & 0x1f);
      uVar1 = uVar10 + 1;
      uVar2 = uVar10 + 1;
      if (iVar3 == 0) {
        uVar7 = 0;
        uVar1 = uVar4;
        uVar2 = uVar10;
      }
      uVar10 = uVar2;
      uVar4 = uVar1;
      uVar11 = uVar11 | uVar7;
    }
    if (uVar4 == uVar12) {
      return 0;
    }
    p->nSmallSupp = p->nSmallSupp + (uint)((int)uVar4 < 2);
    uVar10 = 0;
    for (uVar14 = 0; uVar14 < *(uint *)&pMVar13->field_0x4 >> 0x1b; uVar14 = uVar14 + 1) {
      if ((uVar11 >> ((uint)uVar14 & 0x1f) & 1) != 0) {
        if ((long)(int)uVar10 < (long)uVar14) {
          pMVar13->pLeaves[(int)uVar10] = pMVar13->pLeaves[uVar14];
          Abc_TtSwapVars(&local_48,p->nLutSize,uVar10,(uint)uVar14);
        }
        uVar10 = uVar10 + 1;
      }
    }
    if (uVar10 == uVar4) {
      *(uint *)&pMVar13->field_0x4 = *(uint *)&pMVar13->field_0x4 & 0x7ffffff | uVar4 << 0x1b;
      uVar10 = Abc_TtSupportSize(&local_48,6);
      if (uVar4 == uVar10) {
        p_00 = p->vTtMem;
        pwVar5 = &local_48;
LAB_0036ec8f:
        iVar3 = Vec_MemHashInsert(p_00,pwVar5);
        uVar4 = Abc_Var2Lit(iVar3,*(uint *)&pMVar13->field_0x4 & 1);
        *(uint *)&pMVar13->field_0x4 = *(uint *)&pMVar13->field_0x4 & 0xfe000000 | uVar4 & 0x1ffffff
        ;
        return 1;
      }
      __assertion = "nSuppSize == Abc_TtSupportSize(&t, 6)";
      __function = "int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)";
      uVar4 = 0x61;
    }
    else {
      __assertion = "k == nSuppSize";
      __function = "int Mpm_CutTruthMinimize6(Mpm_Man_t *, Mpm_Cut_t *)";
      uVar4 = 0x5f;
    }
  }
  else {
    local_38 = p->Truth0;
    Abc_TtCopy(local_38,pwVar5,p->nTruWords,
               (*(uint *)&pCut0->field_0x4 >> 0x19 ^ *(uint *)&pCut0->field_0x4) & 1 ^ fCompl0);
    Abc_TtCopy(p->Truth1,pwVar6,p->nTruWords,
               (*(uint *)&pCut1->field_0x4 >> 0x19 ^ *(uint *)&pCut1->field_0x4) & 1 ^ fCompl1);
    pMVar13 = local_60;
    Mpm_TruthStretch(local_38,local_60,pCut0,p->nLutSize);
    Mpm_TruthStretch(p->Truth1,pMVar13,pCut1,p->nLutSize);
    if (pCutC != (Mpm_Cut_t *)0x0) {
      pwVar5 = Mpm_CutTruth(p,*(uint *)&pCutC->field_0x4 >> 1 & 0xffffff);
      Abc_TtCopy(p->TruthC,pwVar5,p->nTruWords,
                 (*(uint *)&pCutC->field_0x4 >> 0x19 ^ *(uint *)&pCutC->field_0x4) & 1 ^ fComplC);
      Mpm_TruthStretch(p->TruthC,pMVar13,pCutC,p->nLutSize);
    }
    if (Type == 3) {
      uVar4 = p->nTruWords;
      uVar14 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        p->Truth[uVar14] =
             (p->Truth1[uVar14] ^ p->Truth0[uVar14]) & p->TruthC[uVar14] ^ p->Truth0[uVar14];
      }
    }
    else if (Type == 2) {
      uVar4 = p->nTruWords;
      uVar14 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        p->Truth[uVar14] = p->Truth1[uVar14] ^ p->Truth0[uVar14];
      }
    }
    else {
      if (Type != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                      ,0xca,
                      "int Mpm_CutComputeTruth7(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      uVar4 = p->nTruWords;
      uVar14 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        p->Truth[uVar14] = p->Truth1[uVar14] & p->Truth0[uVar14];
      }
    }
    pwVar5 = p->Truth;
    iVar3 = 0;
    if ((p->Truth[0] & 1) != 0) {
      uVar8 = 0;
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar8;
      }
      for (; iVar3 = 1, uVar14 != uVar8; uVar8 = uVar8 + 1) {
        pwVar5[uVar8] = ~pwVar5[uVar8];
      }
    }
    Var = Vec_MemHashInsert(p->vTtMem,pwVar5);
    uVar4 = Abc_Var2Lit(Var,iVar3);
    *(uint *)&pMVar13->field_0x4 = *(uint *)&pMVar13->field_0x4 & 0xfe000000 | uVar4 & 0x1ffffff;
    if (p->pPars->fCutMin == 0) {
      return 1;
    }
    pwVar6 = Mpm_CutTruth(p,uVar4 >> 1 & 0xffffff);
    uVar10 = *(uint *)&pMVar13->field_0x4 >> 0x1b;
    uVar4 = 0;
    uVar11 = 0;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      iVar3 = Abc_TtHasVar(pwVar6,uVar10,uVar9);
      uVar12 = 1 << ((byte)uVar9 & 0x1f);
      uVar4 = uVar4 + iVar3;
      if (iVar3 == 0) {
        uVar12 = 0;
      }
      uVar11 = uVar11 | uVar12;
    }
    if (uVar4 == *(uint *)&pMVar13->field_0x4 >> 0x1b) {
      return 0;
    }
    p->nSmallSupp = p->nSmallSupp + (uint)(uVar4 < 2);
    Abc_TtCopy(pwVar5,pwVar6,p->nTruWords,0);
    uVar10 = 0;
    for (uVar14 = 0; uVar9 = *(uint *)&pMVar13->field_0x4 >> 0x1b, uVar14 < uVar9;
        uVar14 = uVar14 + 1) {
      if ((uVar11 >> ((uint)uVar14 & 0x1f) & 1) != 0) {
        if ((long)(int)uVar10 < (long)uVar14) {
          pMVar13->pLeaves[(int)uVar10] = pMVar13->pLeaves[uVar14];
          Abc_TtSwapVars(pwVar5,p->nLutSize,uVar10,(uint)uVar14);
        }
        uVar10 = uVar10 + 1;
      }
    }
    if (uVar10 == uVar4) {
      uVar10 = Abc_TtSupportSize(pwVar5,uVar9);
      if (uVar4 == uVar10) {
        *(uint *)&pMVar13->field_0x4 = *(uint *)&pMVar13->field_0x4 & 0x7ffffff | uVar4 << 0x1b;
        p_00 = p->vTtMem;
        goto LAB_0036ec8f;
      }
      __assertion = "nSuppSize == Abc_TtSupportSize(p->Truth, Mpm_CutLeafNum(pCut))";
      __function = "int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)";
      uVar4 = 0x7f;
    }
    else {
      __assertion = "k == nSuppSize";
      __function = "int Mpm_CutTruthMinimize7(Mpm_Man_t *, Mpm_Cut_t *)";
      uVar4 = 0x7e;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmTruth.c"
                ,uVar4,__function);
}

Assistant:

int Mpm_CutComputeTruth( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int RetValue;
    if ( p->nLutSize <= 6 )
        RetValue = Mpm_CutComputeTruth6( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
    else
        RetValue = Mpm_CutComputeTruth7( p, pCut, pCut0, pCut1, pCutC, fCompl0, fCompl1, fComplC, Type );
#ifdef MPM_TRY_NEW
    {
        extern unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm );
        char pCanonPerm[16];
        memcpy( p->Truth0, p->Truth, sizeof(word) * p->nTruWords );
        Abc_TtCanonicize( p->Truth0, pCut->nLimit, pCanonPerm );
    }
#endif
    return RetValue;
}